

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.cpp
# Opt level: O2

int ncnn::reduction_op<std::plus<float>,std::plus<float>>
              (Mat *a,Mat *b,float v0,int dim,float coeff,Option *opt)

{
  uint uVar1;
  size_t sVar2;
  void *pvVar3;
  size_t sVar4;
  int i_2;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  Allocator *pAVar10;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  uint _w;
  void *pvVar15;
  uint uVar16;
  int q;
  long lVar17;
  bool bVar18;
  float fVar19;
  Mat mins;
  Mat local_70;
  void *local_38;
  
  uVar13 = a->w;
  uVar1 = a->h;
  _w = a->c;
  uVar8 = (ulong)_w;
  sVar2 = a->elemsize;
  if (dim == 0) {
    pAVar10 = opt->blob_allocator;
    uVar16 = 1;
    goto LAB_00114d08;
  }
  switch(dim) {
  default:
    goto switchD_00114cd3_caseD_0;
  case 1:
    pAVar10 = opt->blob_allocator;
    uVar16 = _w;
LAB_00114d08:
    Mat::create(b,uVar16,sVar2,pAVar10);
    goto switchD_00114cd3_caseD_0;
  case 2:
    pAVar10 = opt->blob_allocator;
    uVar16 = uVar1;
    uVar5 = _w;
    break;
  case -2:
    pAVar10 = opt->blob_allocator;
    uVar16 = uVar13;
    uVar5 = uVar1;
    break;
  case -1:
    pAVar10 = opt->blob_allocator;
    uVar16 = uVar13;
    goto LAB_00114d08;
  }
  Mat::create(b,uVar16,uVar5,sVar2,pAVar10);
switchD_00114cd3_caseD_0:
  if (b->data == (void *)0x0) {
    return -100;
  }
  if ((long)b->c * b->cstep == 0) {
    return -100;
  }
  uVar16 = uVar1 * uVar13;
  if (dim == 0) {
    Mat::Mat(&mins,_w,sVar2,opt->workspace_allocator);
    if ((mins.data == (void *)0x0) || ((long)mins.c * mins.cstep == 0)) {
      Mat::~Mat(&mins);
      return -100;
    }
    uVar14 = 0;
    uVar11 = (ulong)uVar16;
    if ((int)uVar16 < 1) {
      uVar11 = uVar14;
    }
    if ((int)_w < 1) {
      uVar8 = uVar14;
    }
    for (; uVar14 != uVar8; uVar14 = uVar14 + 1) {
      Mat::channel(&local_70,a,(int)uVar14);
      pvVar15 = local_70.data;
      Mat::~Mat(&local_70);
      fVar19 = 0.0;
      for (uVar6 = 0; uVar11 != uVar6; uVar6 = uVar6 + 1) {
        fVar19 = fVar19 + *(float *)((long)pvVar15 + uVar6 * 4);
      }
      *(float *)((long)mins.data + uVar14 * 4) = fVar19;
    }
    fVar19 = 0.0;
    for (uVar11 = 0; uVar8 != uVar11; uVar11 = uVar11 + 1) {
      fVar19 = fVar19 + *(float *)((long)mins.data + uVar11 * 4);
    }
    *(float *)b->data = fVar19 * v0;
LAB_00114eaf:
    Mat::~Mat(&mins);
  }
  else {
    switch(dim) {
    case 0:
      goto switchD_00114d7b_caseD_0;
    case 1:
      uVar11 = (ulong)uVar16;
      if ((int)uVar16 < 1) {
        uVar11 = 0;
      }
      if ((int)_w < 1) {
        uVar8 = 0;
      }
      for (uVar14 = 0; uVar14 != uVar8; uVar14 = uVar14 + 1) {
        Mat::channel(&mins,a,(int)uVar14);
        pvVar15 = mins.data;
        Mat::~Mat(&mins);
        fVar19 = 0.0;
        for (uVar6 = 0; uVar11 != uVar6; uVar6 = uVar6 + 1) {
          fVar19 = fVar19 + *(float *)((long)pvVar15 + uVar6 * 4);
        }
        *(float *)((long)b->data + uVar14 * 4) = fVar19 * v0;
      }
      break;
    case 2:
      uVar16 = 0;
      if (0 < (int)uVar13) {
        uVar16 = uVar13;
      }
      if ((int)uVar1 < 1) {
        uVar1 = 0;
      }
      if ((int)_w < 1) {
        _w = 0;
      }
      for (uVar5 = 0; uVar5 != _w; uVar5 = uVar5 + 1) {
        Mat::channel(&mins,a,uVar5);
        pvVar15 = mins.data;
        Mat::~Mat(&mins);
        Mat::channel(&mins,b,uVar5);
        pvVar3 = mins.data;
        Mat::~Mat(&mins);
        for (uVar8 = 0; uVar8 != uVar1; uVar8 = uVar8 + 1) {
          fVar19 = 0.0;
          uVar9 = uVar16;
          while (bVar18 = uVar9 != 0, uVar9 = uVar9 - 1, bVar18) {
            fVar19 = fVar19 + *(float *)((long)pvVar15 + uVar8 * 4);
          }
          *(float *)((long)pvVar3 + uVar8 * 4) = fVar19 * v0;
          pvVar15 = (void *)((long)pvVar15 + (long)(int)uVar13 * 4);
        }
      }
      break;
    case -2:
      Mat::fill(b,0.0);
      uVar13 = 0;
      if ((int)uVar16 < 1) {
        uVar16 = 0;
      }
      if ((int)_w < 1) {
        _w = 0;
      }
      for (; uVar13 != _w; uVar13 = uVar13 + 1) {
        Mat::channel(&mins,a,uVar13);
        pvVar3 = mins.data;
        Mat::~Mat(&mins);
        pvVar15 = b->data;
        for (uVar8 = 0; uVar16 != uVar8; uVar8 = uVar8 + 1) {
          *(float *)((long)pvVar15 + uVar8 * 4) =
               *(float *)((long)pvVar3 + uVar8 * 4) + *(float *)((long)pvVar15 + uVar8 * 4);
        }
      }
      pvVar15 = b->data;
      for (uVar8 = 0; uVar16 != uVar8; uVar8 = uVar8 + 1) {
        *(float *)((long)pvVar15 + uVar8 * 4) = *(float *)((long)pvVar15 + uVar8 * 4) * v0;
      }
      return 0;
    case -1:
      Mat::Mat(&mins,uVar13,1,_w,sVar2,opt->workspace_allocator);
      if ((mins.data == (void *)0x0) || ((long)mins.c * mins.cstep == 0)) {
        Mat::~Mat(&mins);
        return -100;
      }
      Mat::fill(&mins,0.0);
      uVar11 = 0;
      uVar14 = 0;
      if (0 < (int)uVar13) {
        uVar14 = (ulong)uVar13;
      }
      uVar6 = (ulong)uVar1;
      if ((int)uVar1 < 1) {
        uVar6 = uVar11;
      }
      if ((int)_w < 1) {
        uVar8 = uVar11;
      }
      for (; uVar11 != uVar8; uVar11 = uVar11 + 1) {
        Mat::channel(&local_70,a,(int)uVar11);
        pvVar15 = local_70.data;
        Mat::~Mat(&local_70);
        sVar4 = mins.cstep;
        sVar2 = mins.elemsize;
        local_38 = mins.data;
        local_70.data = (void *)(mins.cstep * uVar11 * mins.elemsize + (long)mins.data);
        local_70.refcount = (int *)0x0;
        local_70.elemsize = mins.elemsize;
        local_70.allocator = mins.allocator;
        local_70.dims = 2;
        local_70.w = mins.w;
        local_70.h = mins.h;
        local_70.c = 1;
        local_70.cstep = (size_t)(mins.h * mins.w);
        Mat::~Mat(&local_70);
        lVar17 = sVar4 * sVar2 * uVar11;
        for (uVar7 = 0; uVar7 != uVar6; uVar7 = uVar7 + 1) {
          for (uVar12 = 0; uVar14 != uVar12; uVar12 = uVar12 + 1) {
            *(float *)((long)local_38 + uVar12 * 4 + lVar17) =
                 *(float *)((long)pvVar15 + uVar7 * 4) +
                 *(float *)((long)local_38 + uVar12 * 4 + lVar17);
          }
          pvVar15 = (void *)((long)pvVar15 + (long)(int)uVar13 * 4);
        }
      }
      Mat::fill(b,0.0);
      for (uVar11 = 0; sVar4 = mins.cstep, sVar2 = mins.elemsize, pvVar15 = mins.data,
          uVar11 != uVar8; uVar11 = uVar11 + 1) {
        local_70.data = (void *)(mins.cstep * uVar11 * mins.elemsize + (long)mins.data);
        local_70.refcount = (int *)0x0;
        local_70.elemsize = mins.elemsize;
        local_70.allocator = mins.allocator;
        local_70.dims = 2;
        local_70.w = mins.w;
        local_70.h = mins.h;
        local_70.c = 1;
        local_70.cstep = (size_t)(mins.h * mins.w);
        Mat::~Mat(&local_70);
        pvVar3 = b->data;
        for (uVar6 = 0; uVar14 != uVar6; uVar6 = uVar6 + 1) {
          *(float *)((long)pvVar3 + uVar6 * 4) =
               *(float *)((long)pvVar15 + uVar6 * 4 + sVar4 * sVar2 * uVar11) +
               *(float *)((long)pvVar3 + uVar6 * 4);
        }
      }
      pvVar15 = b->data;
      for (uVar8 = 0; uVar14 != uVar8; uVar8 = uVar8 + 1) {
        *(float *)((long)pvVar15 + uVar8 * 4) = *(float *)((long)pvVar15 + uVar8 * 4) * v0;
      }
      goto LAB_00114eaf;
    }
  }
switchD_00114d7b_caseD_0:
  return 0;
}

Assistant:

static int reduction_op(const Mat& a, Mat& b, float v0, int dim, float coeff, const Option& opt)
{
    Op op;
    Op2 op2;

    int w = a.w;
    int h = a.h;
    int channels = a.c;
    size_t elemsize = a.elemsize;
    int size = w * h;

    if (dim == 0)
    {
        // w h c -> X X X
        b.create(1, elemsize, opt.blob_allocator);
    }
    else if (dim == 1)
    {
        // w h c -> X X c
        b.create(channels, elemsize, opt.blob_allocator);
    }
    else if (dim == 2)
    {
        // w h c -> X h c
        b.create(h, channels, elemsize, opt.blob_allocator);
    }
    else if (dim == -1)
    {
        // w h c -> w X X
        b.create(w, elemsize, opt.blob_allocator);
    }
    else if (dim == -2)
    {
        // w h c -> w h X
        b.create(w, h, elemsize, opt.blob_allocator);
    }
    if (b.empty())
        return -100;

    if (dim == 0)
    {
        Mat sums(channels, elemsize, opt.workspace_allocator);
        if (sums.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            const float* ptr = a.channel(q);

            float sum = v0;
            for (int i=0; i<size; i++)
            {
                sum = op(sum, ptr[i]);
            }

            sums[q] = sum;
        }

        float sum = v0;
        for (int i=0; i<channels; i++)
        {
            sum = op2(sum, sums[i]);
        }

        b[0] = sum * coeff;
    }
    else if (dim == 1)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            const float* ptr = a.channel(q);

            float sum = v0;
            for (int i=0; i<size; i++)
            {
                sum = op(sum, ptr[i]);
            }

            b[q] = sum * coeff;
        }
    }
    else if (dim == 2)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            const float* ptr = a.channel(q);
            float* outptr = b.channel(q);

            for (int i=0; i<h; i++)
            {
                float sum = v0;
                for (int j=0; j<w; j++)
                {
                    sum = op(sum, ptr[i]);
                }

                outptr[i] = sum * coeff;

                ptr += w;
            }
        }
    }
    else if (dim == -1)
    {
        Mat mins(w, 1, channels, elemsize, opt.workspace_allocator);
        if (mins.empty())
            return -100;

        mins.fill(v0);

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            const float* ptr = a.channel(q);
            float* mins_ptr = mins.channel(q);

            for (int i=0; i<h; i++)
            {
                for (int j=0; j<w; j++)
                {
                    mins_ptr[j] = op(mins_ptr[j], ptr[i]);
                }

                ptr += w;
            }
        }

        b.fill(v0);

        for (int q=0; q<channels; q++)
        {
            const float* mins_ptr = mins.channel(q);
            for (int j=0; j<w; j++)
            {
                b[j] = op2(b[j], mins_ptr[j]);
            }
        }

        for (int j=0; j<w; j++)
        {
            b[j] *= coeff;
        }
    }
    else if (dim == -2)
    {
        b.fill(v0);

        for (int q=0; q<channels; q++)
        {
            const float* ptr = a.channel(q);

            for (int i=0; i<size; i++)
            {
                b[i] = op(b[i], ptr[i]);
            }
        }

        for (int i=0; i<size; i++)
        {
            b[i] *= coeff;
        }
    }

    return 0;
}